

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  int iVar1;
  u32 uVar2;
  u32 iChild;
  u8 *p;
  char *pcVar3;
  bool bVar4;
  Pgno iFreePage;
  u32 n;
  uchar *pOvflData;
  DbPage *pOvflPage;
  int nErrAtStart;
  u32 expected;
  int i;
  u32 N_local;
  Pgno iPage_local;
  int isFreeList_local;
  IntegrityCk *pCheck_local;
  
  pOvflPage._0_4_ = pCheck->nErr;
  pOvflPage._4_4_ = N;
  expected = N;
  i = iPage;
  N_local = isFreeList;
  _iPage_local = pCheck;
  while( true ) {
    bVar4 = false;
    if (i != 0) {
      bVar4 = _iPage_local->mxErr != 0;
    }
    if ((!bVar4) || (iVar1 = checkRef(_iPage_local,i), iVar1 != 0)) goto LAB_00206cdb;
    expected = expected - 1;
    iVar1 = sqlite3PagerGet(_iPage_local->pPager,i,(DbPage **)&pOvflData,0);
    if (iVar1 != 0) break;
    p = (u8 *)sqlite3PagerGetData((DbPage *)pOvflData);
    if (N_local == 0) {
      if ((_iPage_local->pBt->autoVacuum != '\0') && (expected != 0)) {
        nErrAtStart = sqlite3Get4byte(p);
        checkPtrmap(_iPage_local,nErrAtStart,'\x04',i);
      }
    }
    else {
      uVar2 = sqlite3Get4byte(p + 4);
      if (_iPage_local->pBt->autoVacuum != '\0') {
        checkPtrmap(_iPage_local,i,'\x02',0);
      }
      if ((_iPage_local->pBt->usableSize >> 2) - 2 < uVar2) {
        checkAppendMsg(_iPage_local,"freelist leaf count too big on page %d",(ulong)(uint)i);
        expected = expected - 1;
      }
      else {
        for (nErrAtStart = 0; nErrAtStart < (int)uVar2; nErrAtStart = nErrAtStart + 1) {
          iChild = sqlite3Get4byte(p + (nErrAtStart * 4 + 8));
          if (_iPage_local->pBt->autoVacuum != '\0') {
            checkPtrmap(_iPage_local,iChild,'\x02',0);
          }
          checkRef(_iPage_local,iChild);
        }
        expected = expected - uVar2;
      }
    }
    i = sqlite3Get4byte(p);
    sqlite3PagerUnref((DbPage *)pOvflData);
  }
  checkAppendMsg(_iPage_local,"failed to get page %d",(ulong)(uint)i);
LAB_00206cdb:
  if ((expected != 0) && ((int)pOvflPage == _iPage_local->nErr)) {
    pcVar3 = "overflow list length";
    if (N_local != 0) {
      pcVar3 = "size";
    }
    checkAppendMsg(_iPage_local,"%s is %d but should be %d",pcVar3,
                   (ulong)(pOvflPage._4_4_ - expected),(ulong)pOvflPage._4_4_);
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %d but should be %d",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}